

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteModule
          (BinaryWriterSpec *this,string_view filename,Module *module)

{
  Result RVar1;
  Stream *stream;
  
  stream = std::function<wabt::Stream_*(std::basic_string_view<char,_std::char_traits<char>_>)>::
           operator()(&this->module_stream_factory_,filename);
  RVar1 = WriteBinaryModule(stream,module,this->options_);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  return;
}

Assistant:

void BinaryWriterSpec::WriteModule(std::string_view filename,
                                   const Module& module) {
  result_ |=
      WriteBinaryModule(module_stream_factory_(filename), &module, options_);
}